

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::InitializeElementMatrix
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *this,TPZElementMatrix *ek,
          TPZElementMatrix *ef)

{
  long lVar1;
  uint num_of_blocks;
  int iVar2;
  int iVar3;
  TPZCompMesh *pTVar4;
  TPZConnect *pTVar5;
  long lVar6;
  long *plVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  _List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> local_48;
  
  pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
  ek->fMesh = pTVar4;
  pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
  ef->fMesh = pTVar4;
  ek->fType = EK;
  ef->fType = EF;
  num_of_blocks =
       (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))(this);
  uVar10 = 0;
  if (0 < (int)num_of_blocks) {
    uVar11 = 0;
    do {
      pTVar5 = (TPZConnect *)
               (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa8))
                         (this,uVar11);
      pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
      iVar2 = TPZConnect::NDof(pTVar5,pTVar4);
      uVar9 = (int)uVar10 + iVar2;
      uVar10 = (ulong)uVar9;
      uVar11 = uVar11 + 1;
    } while (num_of_blocks != uVar11);
    uVar10 = (ulong)(int)uVar9;
  }
  lVar8 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  lVar6 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  lVar12 = 1;
  if ((lVar6 != 0) &&
     (lVar6 = __dynamic_cast(lVar6,&TPZMaterial::typeinfo,&TPZMatLoadCasesBase::typeinfo,
                             0xfffffffffffffffe), lVar6 != 0)) {
    lVar12 = (long)*(int *)(lVar6 + 8);
  }
  if (0 < lVar8) {
    lVar6 = 0;
    do {
      lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar6
                       );
      if ((lVar1 != 0) &&
         (plVar7 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                          &TPZInterpolationSpace::typeinfo,0), plVar7 != (long *)0x0
         )) {
        plVar7 = (long *)(**(code **)(*plVar7 + 0xb8))(plVar7);
        (**(code **)(*plVar7 + 0x78))(plVar7);
      }
      lVar6 = lVar6 + 0x10;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  iVar2 = (*ek->_vptr_TPZElementMatrix[8])(ek);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x70))
            ((long *)CONCAT44(extraout_var,iVar2),uVar10,uVar10);
  iVar2 = (*ef->_vptr_TPZElementMatrix[8])(ef);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x70))
            ((long *)CONCAT44(extraout_var_00,iVar2),uVar10,lVar12);
  iVar2 = (*ek->_vptr_TPZElementMatrix[10])(ek);
  TPZBlock::SetNBlocks((TPZBlock *)CONCAT44(extraout_var_01,iVar2),num_of_blocks);
  iVar2 = (*ef->_vptr_TPZElementMatrix[10])(ef);
  TPZBlock::SetNBlocks((TPZBlock *)CONCAT44(extraout_var_02,iVar2),num_of_blocks);
  if ((int)num_of_blocks < 1) {
    TPZManVector<long,_10>::Resize
              (&(ek->fConnect).super_TPZManVector<long,_10>,(long)(int)num_of_blocks);
    TPZManVector<long,_10>::Resize
              (&(ef->fConnect).super_TPZManVector<long,_10>,(long)(int)num_of_blocks);
  }
  else {
    uVar11 = 0;
    do {
      pTVar5 = (TPZConnect *)
               (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa8))
                         (this,uVar11);
      pTVar4 = TPZCompEl::Mesh((TPZCompEl *)this);
      iVar2 = TPZConnect::NDof(pTVar5,pTVar4);
      iVar3 = (*ek->_vptr_TPZElementMatrix[10])(ek);
      TPZBlock::Set((TPZBlock *)CONCAT44(extraout_var_03,iVar3),uVar11,iVar2,-1);
      iVar3 = (*ef->_vptr_TPZElementMatrix[10])(ef);
      TPZBlock::Set((TPZBlock *)CONCAT44(extraout_var_04,iVar3),uVar11,iVar2,-1);
      uVar11 = uVar11 + 1;
    } while (num_of_blocks != uVar11);
    uVar10 = (ulong)num_of_blocks;
    TPZManVector<long,_10>::Resize(&(ek->fConnect).super_TPZManVector<long,_10>,uVar10);
    TPZManVector<long,_10>::Resize(&(ef->fConnect).super_TPZManVector<long,_10>,uVar10);
    if (0 < (int)num_of_blocks) {
      uVar13 = 0;
      do {
        lVar8 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa0))
                          (this,uVar13 & 0xffffffff);
        (ek->fConnect).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar13] = lVar8;
        lVar8 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa0))
                          (this,uVar13 & 0xffffffff);
        (ef->fConnect).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar13] = lVar8;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
  }
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            (&local_48,this);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_move_assign
            (&ek->fOneRestraints,&local_48);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&local_48);
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            (&local_48,this);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_move_assign
            (&ef->fOneRestraints,&local_48);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&local_48);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeElementMatrix(TPZElementMatrix &ek, TPZElementMatrix &ef)
{
    ek.fMesh = Mesh();
    ef.fMesh = Mesh();
    ek.fType = TPZElementMatrix::EK;
    ef.fType = TPZElementMatrix::EF;
    const int ncon = this->NConnects();
    int numeq = 0;
    int ic;
    
    for(ic=0; ic<ncon; ic++)
    {
        int64_t neqThisConn = Connect(ic).NDof(*Mesh());
        numeq += neqThisConn;
    }
    
    int64_t nref = this->fElementVec.size();
    int nstate = 0;
    //nstate=1;
    
    const int numloadcases = [this](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(this->Material()); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
    for (int64_t iref=0; iref<nref; iref++) {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (! msp) {
            continue;
        }
        TPZMaterial *mat = msp->Material();
        nstate += mat->NStateVariables();
    }
    
    const int numstate = nstate;
    ek.Matrix().Redim(numeq,numeq);
    ef.Matrix().Redim(numeq,numloadcases);
    ek.Block().SetNBlocks(ncon);
    ef.Block().SetNBlocks(ncon);
    
    int i;
    for(i=0; i<ncon; i++){
        unsigned int ndof = Connect(i).NDof(*Mesh());
#ifdef PZDEBUG
        TPZConnect &c = Connect(i);
        if (c.NShape()*c.NState() != ndof) {
            DebugStop();
        }
#endif
        ek.Block().Set(i,ndof);
        ef.Block().Set(i,ndof);
    }
    ek.fConnect.Resize(ncon);
    ef.fConnect.Resize(ncon);
    for(i=0; i<ncon; i++){
        (ek.fConnect)[i] = ConnectIndex(i);
        (ef.fConnect)[i] = ConnectIndex(i);
    }
    ek.fOneRestraints = GetShapeRestraints();
    ef.fOneRestraints = GetShapeRestraints();
}